

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * jsonnet::internal::jsonnet_unlex(string *__return_storage_ptr__,Tokens *tokens)

{
  char cVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  ostream *poVar5;
  _List_node_base *p_Var6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  _List_node_base *p_Var8;
  _List_node_base *local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_1d8 = (_List_node_base *)tokens;
  do {
    local_1d8 = (((_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *
                  )&local_1d8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (local_1d8 == (_List_node_base *)tokens) {
LAB_001b0ecd:
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return __return_storage_ptr__;
    }
    p_Var3 = local_1d8[2]._M_next;
    for (p_Var6 = local_1d8[1]._M_prev; p_Var6 != p_Var3;
        p_Var6 = (_List_node_base *)&p_Var6[2]._M_prev) {
      iVar2 = *(int *)&p_Var6->_M_next;
      if (iVar2 == 2) {
        std::operator<<(local_1a8,"Paragraph(\n");
        p_Var4 = p_Var6[1]._M_prev;
        for (p_Var8 = p_Var6[1]._M_next; p_Var8 != p_Var4; p_Var8 = p_Var8 + 2) {
          poVar5 = std::operator<<(local_1a8,"    ");
          poVar5 = std::operator<<(poVar5,(string *)p_Var8);
          std::operator<<(poVar5,'\n');
        }
        poVar5 = std::operator<<(local_1a8,")");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        pcVar7 = "\n";
LAB_001b0d65:
        std::operator<<(poVar5,pcVar7);
      }
      else {
        if (iVar2 == 1) {
          poVar5 = std::operator<<(local_1a8,"Interstitial(");
LAB_001b0cea:
          poVar5 = std::operator<<(poVar5,(string *)p_Var6[1]._M_next);
LAB_001b0cf9:
          pcVar7 = ")\n";
          goto LAB_001b0d65;
        }
        if (iVar2 == 0) {
          if (p_Var6[1]._M_prev != p_Var6[1]._M_next) {
            poVar5 = std::operator<<(local_1a8,"LineEnd(");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5,", ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5,", ");
            goto LAB_001b0cea;
          }
          poVar5 = std::operator<<(local_1a8,"LineEnd(");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          goto LAB_001b0cf9;
        }
      }
    }
    iVar2 = *(int *)&local_1d8[1]._M_next;
    if (iVar2 == 0xd) {
      poVar5 = std::operator<<(local_1a8,"\"");
      poVar5 = std::operator<<(poVar5,(string *)(local_1d8 + 3));
      pcVar7 = "\"\n";
    }
    else if (iVar2 == 0xe) {
      poVar5 = std::operator<<(local_1a8,"\'");
      poVar5 = std::operator<<(poVar5,(string *)(local_1d8 + 3));
      pcVar7 = "\'\n";
    }
    else if (iVar2 == 0xf) {
      std::operator<<(local_1a8,"|||\n");
      std::operator<<(local_1a8,(string *)(local_1d8 + 5));
      for (p_Var6 = local_1d8[3]._M_next; *(char *)&p_Var6->_M_next != '\0';
          p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1)) {
        std::operator<<(local_1a8,*(char *)&p_Var6->_M_next);
        if (((*(char *)&p_Var6->_M_next == '\n') &&
            (cVar1 = *(char *)((long)&p_Var6->_M_next + 1), cVar1 != '\0')) && (cVar1 != '\n')) {
          std::operator<<(local_1a8,(string *)(local_1d8 + 5));
        }
      }
      poVar5 = std::operator<<(local_1a8,(string *)(local_1d8 + 7));
      pcVar7 = "|||\n";
    }
    else {
      if (iVar2 == 0x24) {
        std::operator<<(local_1a8,"EOF\n");
        goto LAB_001b0ecd;
      }
      poVar5 = std::operator<<(local_1a8,(string *)(local_1d8 + 3));
      pcVar7 = "\n";
    }
    std::operator<<(poVar5,pcVar7);
  } while( true );
}

Assistant:

std::string jsonnet_unlex(const Tokens &tokens)
{
    std::stringstream ss;
    for (const auto &t : tokens) {
        for (const auto &f : t.fodder) {
            switch (f.kind) {
                case FodderElement::LINE_END: {
                    if (f.comment.size() > 0) {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ", " << f.comment[0]
                           << ")\n";
                    } else {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ")\n";
                    }
                } break;

                case FodderElement::INTERSTITIAL: {
                    ss << "Interstitial(" << f.comment[0] << ")\n";
                } break;

                case FodderElement::PARAGRAPH: {
                    ss << "Paragraph(\n";
                    for (const auto &line : f.comment) {
                        ss << "    " << line << '\n';
                    }
                    ss << ")" << f.blanks << "\n";
                } break;
            }
        }
        if (t.kind == Token::END_OF_FILE) {
            ss << "EOF\n";
            break;
        }
        if (t.kind == Token::STRING_DOUBLE) {
            ss << "\"" << t.data << "\"\n";
        } else if (t.kind == Token::STRING_SINGLE) {
            ss << "'" << t.data << "'\n";
        } else if (t.kind == Token::STRING_BLOCK) {
            ss << "|||\n";
            ss << t.stringBlockIndent;
            for (const char *cp = t.data.c_str(); *cp != '\0'; ++cp) {
                ss << *cp;
                if (*cp == '\n' && *(cp + 1) != '\n' && *(cp + 1) != '\0') {
                    ss << t.stringBlockIndent;
                }
            }
            ss << t.stringBlockTermIndent << "|||\n";
        } else {
            ss << t.data << "\n";
        }
    }
    return ss.str();
}